

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickcdef.c
# Opt level: O0

void cdef_alloc_data(AV1_COMMON *cm,CdefSearchCtx *cdef_search_ctx)

{
  void *pvVar1;
  long in_RSI;
  long in_RDI;
  int nhfb;
  int nvfb;
  
  pvVar1 = aom_malloc(0x2bfb4f);
  *(void **)(in_RSI + 0x1f18) = pvVar1;
  if (*(long *)(in_RSI + 0x1f18) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cdef_search_ctx->sb_index");
  }
  *(undefined4 *)(in_RSI + 0x1f20) = 0;
  pvVar1 = aom_malloc(0x2bfbb0);
  *(void **)(in_RSI + 0x1f08) = pvVar1;
  if (*(long *)(in_RSI + 0x1f08) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cdef_search_ctx->mse[0]");
  }
  pvVar1 = aom_malloc(0x2bfc04);
  *(void **)(in_RSI + 0x1f10) = pvVar1;
  if (*(long *)(in_RSI + 0x1f10) == 0) {
    aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                       "Failed to allocate cdef_search_ctx->mse[1]");
  }
  return;
}

Assistant:

static void cdef_alloc_data(AV1_COMMON *cm, CdefSearchCtx *cdef_search_ctx) {
  const int nvfb = cdef_search_ctx->nvfb;
  const int nhfb = cdef_search_ctx->nhfb;
  CHECK_MEM_ERROR(
      cm, cdef_search_ctx->sb_index,
      aom_malloc(nvfb * nhfb * sizeof(cdef_search_ctx->sb_index[0])));
  cdef_search_ctx->sb_count = 0;
  CHECK_MEM_ERROR(cm, cdef_search_ctx->mse[0],
                  aom_malloc(sizeof(**cdef_search_ctx->mse) * nvfb * nhfb));
  CHECK_MEM_ERROR(cm, cdef_search_ctx->mse[1],
                  aom_malloc(sizeof(**cdef_search_ctx->mse) * nvfb * nhfb));
}